

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O1

void __thiscall soplex::CLUFactorRational::eliminateColSingletons(CLUFactorRational *this)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  Pring *pPVar6;
  int *piVar7;
  int *piVar8;
  pointer pnVar9;
  int *piVar10;
  Pring *pPVar11;
  Pring *pPVar12;
  Pring *pPVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int *piVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  
  pPVar11 = (this->temp).pivot_colNZ;
  pPVar13 = pPVar11[1].prev;
  pPVar12 = pPVar11 + 1;
  if (pPVar13 != pPVar12) {
    do {
      iVar1 = pPVar13->idx;
      piVar3 = (this->u).col.len;
      iVar2 = piVar3[iVar1];
      piVar3[iVar1] = iVar2 + -1;
      piVar4 = (this->u).col.idx;
      piVar5 = (this->u).col.start;
      iVar2 = piVar4[(long)piVar5[iVar1] + -1 + (long)iVar2];
      pPVar12 = (this->temp).pivot_row;
      pPVar6 = pPVar12[iVar2].next;
      pPVar6->prev = pPVar12[iVar2].prev;
      (pPVar12[iVar2].prev)->next = pPVar6;
      piVar7 = (this->u).row.len;
      iVar16 = piVar7[iVar2];
      piVar7[iVar2] = iVar16 + -1;
      piVar7 = (this->u).row.idx;
      lVar18 = (long)(this->u).row.start[iVar2] + -1 + (long)iVar16;
      iVar16 = piVar7[lVar18];
      iVar20 = (int)lVar18;
      iVar15 = iVar20;
      if (iVar16 != iVar1) {
        lVar18 = (long)iVar20;
        piVar8 = (this->temp).s_cact;
        pPVar12 = (this->temp).pivot_col;
        do {
          iVar15 = piVar5[iVar16];
          iVar14 = piVar3[iVar16];
          iVar19 = piVar8[iVar16];
          piVar8[iVar16] = iVar19 + -1;
          iVar19 = (iVar15 + iVar14) - iVar19;
          piVar10 = piVar4 + iVar19;
          do {
            piVar17 = piVar10;
            piVar10 = piVar17 + 1;
          } while (*piVar17 != iVar2);
          *piVar17 = piVar4[iVar19];
          piVar4[iVar19] = iVar2;
          iVar15 = piVar8[iVar16];
          pPVar6 = pPVar12[iVar16].next;
          pPVar6->prev = pPVar12[iVar16].prev;
          (pPVar12[iVar16].prev)->next = pPVar6;
          pPVar6 = pPVar11[iVar15].next;
          pPVar12[iVar16].next = pPVar6;
          pPVar6->prev = pPVar12 + iVar16;
          pPVar12[iVar16].prev = pPVar11 + iVar15;
          pPVar11[iVar15].next = pPVar12 + iVar16;
          iVar16 = piVar7[lVar18 + -1];
          lVar18 = lVar18 + -1;
        } while (iVar16 != iVar1);
        iVar15 = (int)lVar18;
      }
      iVar16 = (this->temp).stage;
      (this->temp).stage = iVar16 + 1;
      setPivot(this,iVar16,iVar1,iVar2,
               (this->u).row.val.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar18);
      piVar3 = (this->u).row.idx;
      piVar3[lVar18] = piVar3[iVar20];
      pnVar9 = (this->u).row.val.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)(pnVar9 + lVar18),
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)(pnVar9 + iVar20));
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)&pnVar9[lVar18].m_backend.m_value + 0x20),
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)&pnVar9[iVar20].m_backend.m_value + 0x20));
      iVar1 = (this->u).row.start[iVar2];
      if (iVar1 < iVar15) {
        piVar3 = (this->u).row.idx;
        piVar4 = (this->u).col.idx;
        piVar5 = (this->u).col.len;
        piVar7 = (this->u).col.start;
        piVar8 = (this->temp).s_cact;
        pPVar12 = (this->temp).pivot_col;
        pPVar11 = (this->temp).pivot_colNZ;
        lVar18 = (long)iVar15;
        do {
          iVar16 = piVar3[lVar18 + -1];
          lVar18 = lVar18 + -1;
          iVar15 = piVar7[iVar16];
          iVar20 = piVar5[iVar16];
          iVar14 = piVar8[iVar16];
          piVar8[iVar16] = iVar14 + -1;
          iVar14 = (iVar15 + iVar20) - iVar14;
          piVar10 = piVar4 + iVar14;
          do {
            piVar17 = piVar10;
            piVar10 = piVar17 + 1;
          } while (*piVar17 != iVar2);
          *piVar17 = piVar4[iVar14];
          piVar4[iVar14] = iVar2;
          iVar15 = piVar8[iVar16];
          pPVar6 = pPVar12[iVar16].next;
          pPVar6->prev = pPVar12[iVar16].prev;
          (pPVar12[iVar16].prev)->next = pPVar6;
          pPVar6 = pPVar11[iVar15].next;
          pPVar12[iVar16].next = pPVar6;
          pPVar6->prev = pPVar12 + iVar16;
          pPVar12[iVar16].prev = pPVar11 + iVar15;
          pPVar11[iVar15].next = pPVar12 + iVar16;
        } while (iVar1 < lVar18);
      }
      pPVar13 = pPVar13->prev;
      pPVar11 = (this->temp).pivot_colNZ;
      pPVar12 = pPVar11 + 1;
    } while (pPVar13 != pPVar12);
  }
  pPVar11[1].next = pPVar11 + 1;
  pPVar11[1].prev = pPVar12;
  return;
}

Assistant:

inline void CLUFactorRational::eliminateColSingletons()
{
   int i, j, k, m, c;
   int pcol, prow;
   CLUFactorRational::Pring* sing;

   for(sing = temp.pivot_colNZ[1].prev;
         sing != &(temp.pivot_colNZ[1]);
         sing = sing->prev)
   {
      /*      Find pivot value
       */
      pcol = sing->idx;
      j = --(u.col.len[pcol]) + u.col.start[pcol];   /* remove pivot column */
      prow = u.col.idx[j];
      removeDR(temp.pivot_row[prow]);

      j = --(u.row.len[prow]) + u.row.start[prow];

      for(i = j; (c = u.row.idx[i]) != pcol; --i)
      {
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }

      /*      remove pivot element from pivot row
       */
      setPivot(temp.stage++, pcol, prow, u.row.val[i]);

      u.row.idx[i] = u.row.idx[j];

      u.row.val[i] = u.row.val[j];

      j = u.row.start[prow];

      for(--i; i >= j; --i)
      {
         c = u.row.idx[i];
         m = u.col.len[c] + u.col.start[c] - (temp.s_cact[c])--;

         for(k = m; u.col.idx[k] != prow; ++k)
            ;

         u.col.idx[k] = u.col.idx[m];

         u.col.idx[m] = prow;

         m = temp.s_cact[c];

         removeDR(temp.pivot_col[c]);

         init2DR(temp.pivot_col[c], temp.pivot_colNZ[m]);

         assert(col.perm[c] < 0);
      }
   }

   initDR(temp.pivot_colNZ[1]);    /* Remove all column singletons from list */
}